

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void lyxml_free_withsiblings(ly_ctx *ctx,lyxml_elem *elem)

{
  lyxml_elem *plVar1;
  lyxml_elem *plVar2;
  lyxml_elem *elem_00;
  
  if (elem != (lyxml_elem *)0x0) {
    plVar1 = elem->prev->next;
    elem_00 = elem->prev;
    while (plVar1 != (lyxml_elem *)0x0) {
      plVar2 = elem_00->prev;
      lyxml_free(ctx,elem_00);
      elem_00 = plVar2;
      plVar1 = plVar2->next;
    }
    while (elem != (lyxml_elem *)0x0) {
      plVar1 = elem->next;
      lyxml_unlink_elem(ctx,elem,2);
      lyxml_free_elem(ctx,elem);
      elem = plVar1;
    }
  }
  return;
}

Assistant:

API void
lyxml_free_withsiblings(struct ly_ctx *ctx, struct lyxml_elem *elem)
{
    struct lyxml_elem *iter, *aux;

    if (!elem) {
        return;
    }

    /* optimization - avoid freeing (unlinking) the last node of the siblings list */
    /* so, first, free the node's predecessors to the beginning of the list ... */
    for(iter = elem->prev; iter->next; iter = aux) {
        aux = iter->prev;
        lyxml_free(ctx, iter);
    }
    /* ... then, the node is the first in the siblings list, so free them all */
    LY_TREE_FOR_SAFE(elem, aux, iter) {
        lyxml_free(ctx, iter);
    }
}